

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<Point>::relocate(QArrayDataPointer<Point> *this,qsizetype offset,Point **data)

{
  bool bVar1;
  Point *in_RDX;
  long in_RSI;
  Point *in_RDI;
  Point **unaff_retaddr;
  Point *res;
  char16_t *n;
  Point *c;
  
  n = (in_RDI->name).d.ptr + in_RSI * 0x18;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<Point,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (Point *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<Point>,Point_const*>
                        (unaff_retaddr,(QArrayDataPointer<Point> *)c), bVar1)) {
    (in_RDX->name).d.d = (in_RDX->name).d.d + in_RSI * 3;
  }
  (in_RDI->name).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }